

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dds_bucket_id_mapping.c
# Opt level: O0

double dds_get_max_addressable_value(dds_bucket_id_mapping *bid_mapping)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double max_addressable_value;
  double den;
  dds_bucket_id_mapping *bid_mapping_local;
  
  if (bid_mapping->type == LOG_UPPER) {
    max_addressable_value = 1.0 - bid_mapping->alpha;
  }
  else if (bid_mapping->type == LOG_LOWER) {
    max_addressable_value = bid_mapping->alpha + 1.0;
  }
  else {
    max_addressable_value = 1.0 - bid_mapping->alpha;
  }
  dVar3 = exp(bid_mapping->log_gamma * 2147483647.0);
  dVar1 = 1.79769313486232e+308 / max_addressable_value;
  dVar2 = dVar1;
  if (dVar3 <= dVar1) {
    dVar2 = dVar3;
  }
  return (double)(~-(ulong)NAN(dVar3) & (ulong)dVar2 | -(ulong)NAN(dVar3) & (ulong)dVar1);
}

Assistant:

double dds_get_max_addressable_value(struct dds_bucket_id_mapping *bid_mapping) {
    double den;
    switch (bid_mapping->type) {
        case LOG_UPPER:
            den = (1 - bid_mapping->alpha);
            break;
        case LOG_LOWER:
            den = (1 + bid_mapping->alpha);
            break;
        default:
            den = (1 - bid_mapping->alpha);
    }
    double max_addressable_value = fmin(exp(INT_MAX * bid_mapping->log_gamma),DBL_MAX / den);
    return max_addressable_value;
}